

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.hpp
# Opt level: O0

string * __thiscall Pcode::ToString_abi_cxx11_(string *__return_storage_ptr__,Pcode *this)

{
  char *pcVar1;
  __type _Var2;
  allocator local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  allocator local_2e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  allocator local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  allocator local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  allocator local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  allocator local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  allocator local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  allocator local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Pcode *local_18;
  Pcode *this_local;
  
  local_18 = this;
  this_local = (Pcode *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  _Var2 = std::operator==(&this->m_comment,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (_Var2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"\t",&local_111);
    std::operator+(&local_f0,&this->m_num1,&local_110);
    std::operator+(&local_d0,&local_f0,&this->m_num2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"\t",&local_139);
    std::operator+(&local_b0,&local_d0,&local_138);
    pcVar1 = pcode_string[this->m_op];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,pcVar1,&local_161);
    std::operator+(&local_90,&local_b0,&local_160);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,"\t",&local_189);
    std::operator+(&local_70,&local_90,&local_188);
    std::operator+(__return_storage_ptr__,&local_70,&this->m_num3);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_290,"\t",&local_291);
    std::operator+(&local_270,&this->m_num1,&local_290);
    std::operator+(&local_250,&local_270,&this->m_num2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b8,"\t",&local_2b9);
    std::operator+(&local_230,&local_250,&local_2b8);
    pcVar1 = pcode_string[this->m_op];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e0,pcVar1,&local_2e1);
    std::operator+(&local_210,&local_230,&local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_308,"\t",&local_309);
    std::operator+(&local_1f0,&local_210,&local_308);
    std::operator+(&local_1d0,&local_1f0,&this->m_num3);
    std::operator+(&local_1b0,&local_1d0,"\t");
    std::operator+(__return_storage_ptr__,&local_1b0,&this->m_comment);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
  }
  return __return_storage_ptr__;
}

Assistant:

string ToString() {
        if (m_comment == string(""))
            return m_num1 + string("\t") + m_num2 + string("\t") + string(pcode_string[m_op]) + string("\t") + m_num3;
        else
            return m_num1 + string("\t") + m_num2 + string("\t") + string(pcode_string[m_op]) + string("\t") + m_num3 + "\t" + m_comment;
    }